

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O0

boolean does_block(level *lev,int x,int y,monst *excludemon)

{
  monst *local_48;
  rm *loc;
  monst *mon;
  obj *obj;
  monst *excludemon_local;
  int y_local;
  int x_local;
  level *lev_local;
  
  if (((lev->locations[x][y].typ < '\x11') || (lev->locations[x][y].typ == '\r')) ||
     ((lev->locations[x][y].typ == '\x17' &&
      ((*(uint *)&lev->locations[x][y].field_0x6 >> 4 & 0x1c) != 0)))) {
    lev_local._7_1_ = '\x01';
  }
  else if (((lev->locations[x][y].typ == '&') || (lev->locations[x][y].typ == '\x13')) ||
          ((lev->locations[x][y].typ == '\x12' && (((byte)u._1052_1_ >> 1 & 1) != 0)))) {
    lev_local._7_1_ = '\x01';
  }
  else {
    for (mon = (monst *)lev->objects[x][y]; mon != (monst *)0x0; mon = (monst *)mon->data) {
      if (*(short *)((long)&mon->m_id + 2) == 0x214) {
        return '\x01';
      }
    }
    if ((lev->monsters[x][y] == (monst *)0x0) ||
       ((*(uint *)&lev->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
      local_48 = (monst *)0x0;
    }
    else {
      local_48 = lev->monsters[x][y];
    }
    if ((((local_48 == (monst *)0x0) ||
         (((((*(uint *)&local_48->field_0x60 >> 1 & 1) != 0 && (u.uprops[0xc].intrinsic == 0)) &&
           (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)))) ||
        ((excludemon != (monst *)0x0 && (local_48 == excludemon)))) ||
       (((local_48->data != mons + 0x153 &&
         ((local_48->m_ap_type != '\x01' ||
          ((local_48->mappearance != 0x1c && (local_48->mappearance != 0x1b)))))) &&
        ((local_48->m_ap_type != '\x02' || (local_48->mappearance != 0x214)))))) {
      lev_local._7_1_ = '\0';
    }
    else {
      lev_local._7_1_ = '\x01';
    }
  }
  return lev_local._7_1_;
}

Assistant:

boolean does_block(struct level *lev, int x, int y, const struct monst *excludemon)
{
    struct obj   *obj;
    struct monst *mon;
    struct rm *loc = &lev->locations[x][y];

    /* Features that block . . */
    if (IS_ROCK(loc->typ) || loc->typ == TREE || (IS_DOOR(loc->typ) &&
			    (loc->doormask & (D_CLOSED|D_LOCKED|D_TRAPPED) )))
	return 1;

    if (loc->typ == CLOUD || loc->typ == WATER ||
			(loc->typ == MOAT && Underwater))
	return 1;

    /* Boulders block light. */
    for (obj = lev->objects[x][y]; obj; obj = obj->nexthere)
	if (obj->otyp == BOULDER) return 1;

    /* Mimics mimicing a door or boulder block light. */
    if ((mon = m_at(lev, x,y)) && (!mon->minvis || See_invisible) &&
	(excludemon == NULL || mon != excludemon) &&
	(mon->data == &mons[PM_GIANT_TURTLE] ||
	 ((mon->m_ap_type == M_AP_FURNITURE &&
	   (mon->mappearance == S_hcdoor || mon->mappearance == S_vcdoor)) ||
	  (mon->m_ap_type == M_AP_OBJECT && mon->mappearance == BOULDER))))
	return 1;

    return 0;
}